

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReaderNaive.cpp
# Opt level: O3

StepStatus __thiscall
adios2::core::engine::ssc::SscReaderNaive::BeginStep
          (SscReaderNaive *this,StepMode stepMode,float timeoutSeconds,bool readerLocked)

{
  Buffer *this_00;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>_>_>
  *StructDefs;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>_>
  *this_01;
  int64_t *piVar1;
  byte bVar2;
  int iVar3;
  StepStatus SVar4;
  uint8_t *puVar5;
  void *__src;
  mapped_type *this_02;
  Variable *pVVar6;
  ulong uVar7;
  pointer __src_00;
  size_t __n;
  ulong uVar8;
  vector<char,_std::allocator<char>_> value;
  int globalSize;
  uint64_t pos;
  BlockInfo b;
  vector<char,_std::allocator<char>_> local_1f8;
  int local_1dc;
  ulong local_1d8;
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  undefined1 *local_198 [2];
  undefined1 local_188 [16];
  undefined1 *local_178 [2];
  undefined1 local_168 [16];
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  value_type local_138;
  
  this_00 = &(this->super_SscReaderBase).m_Buffer;
  puVar5 = (uint8_t *)realloc((this->super_SscReaderBase).m_Buffer.m_Buffer,1);
  (this->super_SscReaderBase).m_Buffer.m_Buffer = puVar5;
  (this->super_SscReaderBase).m_Buffer.m_Capacity = 1;
  (this->super_SscReaderBase).m_Buffer.m_Size = 0;
  this_01 = &this->m_BlockMap;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&this_01->_M_h);
  piVar1 = &(this->super_SscReaderBase).m_CurrentStep;
  *piVar1 = *piVar1 + 1;
  local_1b0 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)this_01;
  if ((this->super_SscReaderBase).m_ReaderRank == 0) {
    MPI_Recv(&local_1dc,1,&ompi_mpi_int,(this->super_SscReaderBase).m_WriterMasterStreamRank,0,
             (this->super_SscReaderBase).m_StreamComm,0);
    Buffer::resize(this_00,(long)local_1dc);
    iVar3 = local_1dc;
    __src = malloc((long)local_1dc);
    MPI_Recv(__src,iVar3,&ompi_mpi_char,(this->super_SscReaderBase).m_WriterMasterStreamRank,0,
             (this->super_SscReaderBase).m_StreamComm,0);
    memcpy((this->super_SscReaderBase).m_Buffer.m_Buffer,__src,(long)local_1dc);
    if (__src != (void *)0x0) {
      free(__src);
    }
  }
  MPI_Bcast(&local_1dc,1,&ompi_mpi_int,0,(this->super_SscReaderBase).m_ReaderComm);
  if ((this->super_SscReaderBase).m_ReaderRank != 0) {
    Buffer::resize(this_00,(long)local_1dc);
  }
  SVar4 = EndOfStream;
  if (local_1dc != 1) {
    MPI_Bcast((this->super_SscReaderBase).m_Buffer.m_Buffer,local_1dc,&ompi_mpi_char,0,
              (this->super_SscReaderBase).m_ReaderComm);
    uVar7 = (this->super_SscReaderBase).m_Buffer.m_Size;
    if (uVar7 != 0) {
      StructDefs = &(this->super_SscReaderBase).m_StructDefinitions;
      local_1a0 = 0;
      do {
        puVar5 = (this->super_SscReaderBase).m_Buffer.m_Buffer;
        uVar8 = *(long *)(puVar5 + local_1a0) + local_1a0;
        local_1d8 = *(long *)(puVar5 + local_1a0 + 8) + local_1a0;
        local_1a8 = uVar8;
        if (local_1d8 < uVar8) {
          do {
            bVar2 = (this->super_SscReaderBase).m_Buffer.m_Buffer[local_1d8];
            if (bVar2 == 0x42) {
              local_1d8 = local_1d8 + 1;
              DeserializeAttribute(this_00,&local_1d8,(this->super_SscReaderBase).m_IO,true);
              goto LAB_00150704;
            }
            if (bVar2 == 0x41) {
              local_1d8 = local_1d8 + 1;
              DeserializeStructDefinitions
                        (this_00,&local_1d8,(this->super_SscReaderBase).m_IO,true,StructDefs);
              goto LAB_00150704;
            }
            local_1d8 = local_1d8 + 5;
            local_138.name._M_string_length = 0;
            local_138.name.field_2._M_local_buf[0] = '\0';
            local_138.structDef._M_dataplus._M_p = (pointer)&local_138.structDef.field_2;
            local_138.structDef._M_string_length = 0;
            local_138.structDef.field_2._M_local_buf[0] = '\0';
            local_138.value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_138.value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_138.value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_138.memCount.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_138.memCount.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_138.memCount.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_138.memStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_138.memStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_138.count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_138.memStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_138.count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_138.count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_138.start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_138.start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_138.shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_138.start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_138.shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_138.shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_138.name._M_dataplus._M_p = (pointer)&local_138.name.field_2;
            DeserializeVariable(this_00,(uint)bVar2,&local_1d8,&local_138,
                                (this->super_SscReaderBase).m_IO,true,StructDefs);
            local_138.bufferStart = local_138.bufferStart + local_1a0;
            this_02 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[](local_1b0,&local_138.name);
            std::
            vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
            ::push_back(this_02,&local_138);
            if ((local_138.shapeId != LocalValue) && (local_138.shapeId != GlobalValue))
            goto LAB_001506ef;
            std::vector<char,_std::allocator<char>_>::vector
                      (&local_1f8,local_138.bufferCount,(allocator_type *)local_1d0);
            memcpy(local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_138.value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (long)local_138.value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_138.value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start);
            switch(local_138.type) {
            case Int8:
              pVVar6 = adios2::core::IO::InquireVariable<signed_char>
                                 ((string *)(this->super_SscReaderBase).m_IO);
              goto LAB_00150265;
            case Int16:
              pVVar6 = adios2::core::IO::InquireVariable<short>
                                 ((string *)(this->super_SscReaderBase).m_IO);
              goto LAB_001504ec;
            case Int32:
              pVVar6 = adios2::core::IO::InquireVariable<int>
                                 ((string *)(this->super_SscReaderBase).m_IO);
              goto LAB_00150683;
            case Int64:
              pVVar6 = adios2::core::IO::InquireVariable<long>
                                 ((string *)(this->super_SscReaderBase).m_IO);
              goto LAB_00150489;
            case UInt8:
              pVVar6 = adios2::core::IO::InquireVariable<unsigned_char>
                                 ((string *)(this->super_SscReaderBase).m_IO);
LAB_00150265:
              __src_00 = local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
              if (pVVar6 == (Variable *)0x0) break;
              __n = (long)local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start;
              memcpy(pVVar6 + 0x228,
                     local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,__n);
              memcpy(pVVar6 + 0x229,__src_00,__n);
              pVVar6 = pVVar6 + 0x22a;
              goto LAB_001506d6;
            case UInt16:
              pVVar6 = adios2::core::IO::InquireVariable<unsigned_short>
                                 ((string *)(this->super_SscReaderBase).m_IO);
LAB_001504ec:
              __src_00 = local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
              if (pVVar6 == (Variable *)0x0) break;
              __n = (long)local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start;
              memcpy(pVVar6 + 0x228,
                     local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,__n);
              memcpy(pVVar6 + 0x22a,__src_00,__n);
              pVVar6 = pVVar6 + 0x22c;
              goto LAB_001506d6;
            case UInt32:
              pVVar6 = adios2::core::IO::InquireVariable<unsigned_int>
                                 ((string *)(this->super_SscReaderBase).m_IO);
              goto LAB_00150683;
            case UInt64:
              pVVar6 = adios2::core::IO::InquireVariable<unsigned_long>
                                 ((string *)(this->super_SscReaderBase).m_IO);
              goto LAB_00150489;
            case Float:
              pVVar6 = adios2::core::IO::InquireVariable<float>
                                 ((string *)(this->super_SscReaderBase).m_IO);
LAB_00150683:
              __src_00 = local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
              if (pVVar6 == (Variable *)0x0) break;
              __n = (long)local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start;
              memcpy(pVVar6 + 0x228,
                     local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,__n);
              memcpy(pVVar6 + 0x22c,__src_00,__n);
              pVVar6 = pVVar6 + 0x230;
              goto LAB_001506d6;
            case Double:
              pVVar6 = adios2::core::IO::InquireVariable<double>
                                 ((string *)(this->super_SscReaderBase).m_IO);
              goto LAB_00150489;
            case LongDouble:
              pVVar6 = adios2::core::IO::InquireVariable<long_double>
                                 ((string *)(this->super_SscReaderBase).m_IO);
              __src_00 = local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
              if (pVVar6 == (Variable *)0x0) break;
              __n = (long)local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start;
              memcpy(pVVar6 + 0x230,
                     local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,__n);
              memcpy(pVVar6 + 0x240,__src_00,__n);
              pVVar6 = pVVar6 + 0x250;
              goto LAB_001506d6;
            case FloatComplex:
              pVVar6 = adios2::core::IO::InquireVariable<std::complex<float>>
                                 ((string *)(this->super_SscReaderBase).m_IO);
LAB_00150489:
              __src_00 = local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
              if (pVVar6 != (Variable *)0x0) {
                __n = (long)local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start;
                memcpy(pVVar6 + 0x228,
                       local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,__n);
                memcpy(pVVar6 + 0x230,__src_00,__n);
                pVVar6 = pVVar6 + 0x238;
LAB_001506d6:
                memcpy(pVVar6,__src_00,__n);
              }
              break;
            case DoubleComplex:
              pVVar6 = adios2::core::IO::InquireVariable<std::complex<double>>
                                 ((string *)(this->super_SscReaderBase).m_IO);
              __src_00 = local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
              if (pVVar6 != (Variable *)0x0) {
                __n = (long)local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start;
                memcpy(pVVar6 + 0x228,
                       local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,__n);
                memcpy(pVVar6 + 0x238,__src_00,__n);
                pVVar6 = pVVar6 + 0x248;
                goto LAB_001506d6;
              }
              break;
            case String:
              pVVar6 = adios2::core::IO::InquireVariable<std::__cxx11::string>
                                 ((string *)(this->super_SscReaderBase).m_IO);
              if (pVVar6 != (Variable *)0x0) {
                local_1d0[0] = local_1c0;
                std::__cxx11::string::
                _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                          ((string *)local_1d0,
                           local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish);
                std::__cxx11::string::operator=((string *)(pVVar6 + 0x268),(string *)local_1d0);
                if (local_1d0[0] != local_1c0) {
                  operator_delete(local_1d0[0]);
                }
                local_1d0[0] = local_1c0;
                std::__cxx11::string::
                _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                          ((string *)local_1d0,
                           local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish);
                std::__cxx11::string::operator=((string *)(pVVar6 + 0x228),(string *)local_1d0);
                if (local_1d0[0] != local_1c0) {
                  operator_delete(local_1d0[0]);
                }
                local_1d0[0] = local_1c0;
                std::__cxx11::string::
                _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                          ((string *)local_1d0,
                           local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish);
                std::__cxx11::string::operator=((string *)(pVVar6 + 0x248),(string *)local_1d0);
                if (local_1d0[0] != local_1c0) {
                  operator_delete(local_1d0[0]);
                }
              }
              break;
            case Char:
              pVVar6 = adios2::core::IO::InquireVariable<char>
                                 ((string *)(this->super_SscReaderBase).m_IO);
              __src_00 = local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
              if (pVVar6 != (Variable *)0x0) {
                __n = (long)local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start;
                memcpy(pVVar6 + 0x228,
                       local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,__n);
                memcpy(pVVar6 + 0x229,__src_00,__n);
                pVVar6 = pVVar6 + 0x22a;
                goto LAB_001506d6;
              }
              break;
            default:
              local_1d0[0] = local_1c0;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"Engine","");
              local_178[0] = local_168;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_178,"SscReaderNaive","");
              local_198[0] = local_188;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"BeginStep","");
              local_158[0] = local_148;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_158,"unknown data type","");
              iVar3 = (this->super_SscReaderBase).m_ReaderRank;
              adios2::helper::Log((string *)local_1d0,(string *)local_178,(string *)local_198,
                                  (string *)local_158,iVar3,iVar3,0,
                                  (this->super_SscReaderBase).m_Verbosity,FATALERROR);
              if (local_158[0] != local_148) {
                operator_delete(local_158[0]);
              }
              if (local_198[0] != local_188) {
                operator_delete(local_198[0]);
              }
              if (local_178[0] != local_168) {
                operator_delete(local_178[0]);
              }
              if (local_1d0[0] != local_1c0) {
                operator_delete(local_1d0[0]);
              }
            }
            if (local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
LAB_001506ef:
            BlockInfo::~BlockInfo(&local_138);
            uVar8 = local_1a8;
LAB_00150704:
          } while (local_1d8 < uVar8);
          uVar7 = (this->super_SscReaderBase).m_Buffer.m_Size;
        }
        local_1a0 = local_1d8;
      } while (local_1d8 < uVar7);
    }
    SVar4 = OK;
  }
  return SVar4;
}

Assistant:

StepStatus SscReaderNaive::BeginStep(const StepMode stepMode, const float timeoutSeconds,
                                     const bool readerLocked)
{

    m_Buffer.clear();
    m_BlockMap.clear();

    ++m_CurrentStep;

    int globalSize;

    if (m_ReaderRank == 0)
    {
        MPI_Recv(&globalSize, 1, MPI_INT, m_WriterMasterStreamRank, 0, m_StreamComm,
                 MPI_STATUS_IGNORE);
        m_Buffer.resize(globalSize);
        //        MPI_Recv(m_Buffer.data(), globalSize, MPI_CHAR,
        //        m_WriterMasterStreamRank, 0, m_StreamComm, MPI_STATUS_IGNORE);
        // TODO: revert when the crusher MPI bug is fixed
        ssc::Buffer tmp(globalSize);
        MPI_Recv(tmp.data(), globalSize, MPI_CHAR, m_WriterMasterStreamRank, 0, m_StreamComm,
                 MPI_STATUS_IGNORE);
        std::memcpy(m_Buffer.data(), tmp.data(), globalSize);
    }

    MPI_Bcast(&globalSize, 1, MPI_INT, 0, m_ReaderComm);
    if (m_ReaderRank != 0)
    {
        m_Buffer.resize(globalSize);
    }
    if (globalSize == 1)
    {
        return StepStatus::EndOfStream;
    }
    MPI_Bcast(m_Buffer.data(), globalSize, MPI_CHAR, 0, m_ReaderComm);

    uint64_t pos = 0;
    while (pos < m_Buffer.size())
    {
        uint64_t start = pos;
        uint64_t end = pos + m_Buffer.value<uint64_t>(pos);
        pos += m_Buffer.value<uint64_t>(pos + 8);

        while (pos < end)
        {
            uint8_t shapeId = m_Buffer[pos];
            ++pos;

            if (shapeId == 65)
            {
                DeserializeStructDefinitions(m_Buffer, pos, m_IO, true, m_StructDefinitions);
            }
            else if (shapeId == 66)
            {
                DeserializeAttribute(m_Buffer, pos, m_IO, true);
            }
            else
            {
                pos += 4;
                ssc::BlockInfo b;
                DeserializeVariable(m_Buffer, static_cast<ShapeID>(shapeId), pos, b, m_IO, true,
                                    m_StructDefinitions);
                b.bufferStart += start;
                m_BlockMap[b.name].push_back(b);
                if (b.shapeId == ShapeID::GlobalValue || b.shapeId == ShapeID::LocalValue)
                {
                    std::vector<char> value(b.bufferCount);
                    std::memcpy(value.data(), b.value.data(), b.value.size());

                    if (b.type == DataType::String)
                    {
                        auto variable = m_IO.InquireVariable<std::string>(b.name);
                        if (variable)
                        {
                            variable->m_Value = std::string(value.begin(), value.end());
                            variable->m_Min = std::string(value.begin(), value.end());
                            variable->m_Max = std::string(value.begin(), value.end());
                        }
                    }
#define declare_type(T)                                                                            \
    else if (b.type == helper::GetDataType<T>())                                                   \
    {                                                                                              \
        auto variable = m_IO.InquireVariable<T>(b.name);                                           \
        if (variable)                                                                              \
        {                                                                                          \
            std::memcpy(reinterpret_cast<char *>(&variable->m_Min), value.data(), value.size());   \
            std::memcpy(reinterpret_cast<char *>(&variable->m_Max), value.data(), value.size());   \
            std::memcpy(reinterpret_cast<char *>(&variable->m_Value), value.data(), value.size()); \
        }                                                                                          \
    }
                    ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
                    else
                    {
                        helper::Log("Engine", "SscReaderNaive", "BeginStep", "unknown data type",
                                    m_ReaderRank, m_ReaderRank, 0, m_Verbosity, helper::FATALERROR);
                    }
                }
            }
        }
    }